

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O0

bool user_select_objs_replace_placeholder_proc
               (Am_Object *ph,Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Object local_50 [3];
  undefined1 local_38 [8];
  Am_Value ok;
  Am_Object *sel_widget_local;
  Am_Value *new_value_local;
  Am_Object *ph_local;
  
  ok.value = (anon_union_8_8_ea4c8939_for_value)sel_widget;
  pAVar2 = Am_Object::Get(ph,Am_PLACEHOLDER_INITIALIZED,0);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(ph,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
    ph_local._7_1_ = true;
  }
  else {
    Am_Value::Am_Value((Am_Value *)local_38);
    Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
    Am_Object::Am_Object(local_50,&am_askselectobj);
    Am_Pop_Up_Window_And_Wait(local_50,(Am_Value *)local_38,false);
    Am_Object::~Am_Object(local_50);
    bVar1 = Am_Value::Valid((Am_Value *)local_38);
    if (bVar1) {
      pAVar2 = Am_Object::Get((Am_Object *)ok.value.wrapper_value,0x169,0);
      Am_Value::operator=(new_value,pAVar2);
      if ((am_sdebug & 1U) != 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"for placeholder ");
        poVar3 = operator<<(poVar3,ph);
        poVar3 = std::operator<<(poVar3," setting value to ");
        poVar3 = operator<<(poVar3,new_value);
        this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
      }
      Am_Object::Set(ph,0x169,new_value,0);
      ph_local._7_1_ = true;
    }
    else {
      ph_local._7_1_ = false;
    }
    Am_Value::~Am_Value((Am_Value *)local_38);
  }
  return ph_local._7_1_;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 user_select_objs_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value, Am_Object &sel_widget))
{
  if (ph.Get(Am_PLACEHOLDER_INITIALIZED).Valid()) {
    new_value = ph.Get(Am_VALUE);
    return true;
  } else {
    Am_Value ok;
    ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
    Am_Pop_Up_Window_And_Wait(am_askselectobj, ok, false);
    if (ok.Valid()) {
      new_value = sel_widget.Get(Am_VALUE);
      if (am_sdebug)
        std::cout << "for placeholder " << ph << " setting value to "
                  << new_value << std::endl
                  << std::flush;
      ph.Set(Am_VALUE, new_value);
      return true;
    } else
      return false;
  }
}